

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O2

void __thiscall
kj::_::
TupleImpl<kj::_::Indexes<0ul,1ul,2ul>,kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>>,bool,bool>
::TupleImpl<capnp::Orphan<capnp::compiler::LocatedInteger>,bool,bool>
          (TupleImpl<kj::_::Indexes<0ul,1ul,2ul>,kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>>,bool,bool>
           *this,Tuple<capnp::Orphan<capnp::compiler::LocatedInteger>,_bool,_bool> *other)

{
  NullableValue<capnp::Orphan<capnp::compiler::LocatedInteger>_> local_40;
  
  NullableValue<capnp::Orphan<capnp::compiler::LocatedInteger>_>::NullableValue
            (&local_40,(Orphan<capnp::compiler::LocatedInteger> *)other);
  Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>::Maybe
            ((Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_> *)this,
             (Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_> *)&local_40);
  NullableValue<capnp::Orphan<capnp::compiler::LocatedInteger>_>::~NullableValue(&local_40);
  this[0x28] = (TupleImpl<kj::_::Indexes<0ul,1ul,2ul>,kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>>,bool,bool>
                )(other->impl).super_TupleElement<1U,_bool>.value;
  this[0x29] = (TupleImpl<kj::_::Indexes<0ul,1ul,2ul>,kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>>,bool,bool>
                )(other->impl).super_TupleElement<2U,_bool>.value;
  return;
}

Assistant:

constexpr inline TupleImpl(Tuple<U...>&& other)
      : TupleElement<indexes, Types>(kj::fwd<U>(getImpl<indexes>(other)))... {}